

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Regex::InternalSwap(Regex *this,Regex *other)

{
  uint32 uVar1;
  void *pvVar2;
  string *psVar3;
  UnknownFieldSet *other_00;
  
  pvVar2 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_00184002;
LAB_00183ff5:
    other_00 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_00183ff5;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_00184002:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  if (((this->pattern_).ptr_ !=
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->pattern_).ptr_ !=
      (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar3 = google::protobuf::internal::ArenaStringPtr::Mutable
                       (&this->pattern_,
                        (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                        (Arena *)0x0);
    google::protobuf::internal::ArenaStringPtr::Mutable
              (&other->pattern_,
               (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (Arena *)0x0);
    std::__cxx11::string::swap((string *)psVar3);
  }
  if (((this->replacement_).ptr_ ==
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     ((other->replacement_).ptr_ ==
      (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    return;
  }
  psVar3 = google::protobuf::internal::ArenaStringPtr::Mutable
                     (&this->replacement_,
                      (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                      (Arena *)0x0);
  google::protobuf::internal::ArenaStringPtr::Mutable
            (&other->replacement_,
             (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (Arena *)0x0);
  std::__cxx11::string::swap((string *)psVar3);
  return;
}

Assistant:

void Regex::InternalSwap(Regex* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  pattern_.Swap(&other->pattern_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  replacement_.Swap(&other->replacement_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
}